

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.cpp
# Opt level: O1

string * __thiscall
LiteScript::_Type_BOOLEAN::ToString_abi_cxx11_
          (string *__return_storage_ptr__,_Type_BOOLEAN *this,Variable *obj)

{
  byte bVar1;
  Object *pOVar2;
  char *pcVar3;
  
  pOVar2 = Variable::operator->(obj);
  bVar1 = *pOVar2->data;
  pcVar3 = "false";
  if ((ulong)bVar1 != 0) {
    pcVar3 = "true";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar3 + ((ulong)bVar1 ^ 5));
  return __return_storage_ptr__;
}

Assistant:

std::string LiteScript::_Type_BOOLEAN::ToString(const LiteScript::Variable & obj) const {
    return ((obj->GetData<bool>()) ? "true" : "false");
}